

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

void __thiscall
TPZManVector<TPZEqnArray<long_double>,_10>::~TPZManVector
          (TPZManVector<TPZEqnArray<long_double>,_10> *this)

{
  TPZEqnArray<long_double> *pTVar1;
  long lVar2;
  long lVar3;
  
  (this->super_TPZVec<TPZEqnArray<long_double>_>)._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_019b6140;
  if ((this->super_TPZVec<TPZEqnArray<long_double>_>).fStore ==
      (TPZEqnArray<long_double> *)&this->field_0x20) {
    (this->super_TPZVec<TPZEqnArray<long_double>_>).fStore = (TPZEqnArray<long_double> *)0x0;
  }
  (this->super_TPZVec<TPZEqnArray<long_double>_>).fNAlloc = 0;
  lVar3 = 0x2e100;
  do {
    TPZEqnArray<long_double>::~TPZEqnArray
              ((TPZEqnArray<long_double> *)
               ((long)&(this->super_TPZVec<TPZEqnArray<long_double>_>)._vptr_TPZVec + lVar3));
    lVar3 = lVar3 + -0x51e0;
  } while (lVar3 != -0x51c0);
  (this->super_TPZVec<TPZEqnArray<long_double>_>)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_019b6180
  ;
  pTVar1 = (this->super_TPZVec<TPZEqnArray<long_double>_>).fStore;
  if (pTVar1 != (TPZEqnArray<long_double> *)0x0) {
    lVar3 = *(long *)&pTVar1[-1].field_0x51d8;
    if (lVar3 != 0) {
      lVar2 = lVar3 * 0x51e0;
      do {
        TPZEqnArray<long_double>::~TPZEqnArray
                  ((TPZEqnArray<long_double> *)
                   ((long)pTVar1[-1].fEqStart.super_TPZManVector<int,_100>.fExtAlloc + lVar2 + -0x28
                   ));
        lVar2 = lVar2 + -0x51e0;
      } while (lVar2 != 0);
    }
    operator_delete__(&pTVar1[-1].fLastTerm,lVar3 * 0x51e0 | 0x10);
    return;
  }
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::~TPZManVector() {
    if (this->fStore == fExtAlloc) {
        this->fStore = nullptr;
    }
    this->fNAlloc = 0;
}